

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void lj_record_call(jit_State *J,BCReg func,ptrdiff_t nargs)

{
  undefined8 in_RDX;
  TraceError e;
  int in_ESI;
  long in_RDI;
  ptrdiff_t in_stack_00000050;
  BCReg in_stack_0000005c;
  jit_State *in_stack_00000060;
  undefined4 in_stack_fffffffffffffff0;
  
  e = (TraceError)((ulong)in_RDX >> 0x20);
  rec_call_setup(in_stack_00000060,in_stack_0000005c,in_stack_00000050);
  *(int *)(in_RDI + 0xe4) = *(int *)(in_RDI + 0xe4) + 1;
  *(ulong *)(in_RDI + 0x88) = *(long *)(in_RDI + 0x88) + (ulong)(in_ESI + 1) * 4;
  *(int *)(in_RDI + 0x98) = in_ESI + 1 + *(int *)(in_RDI + 0x98);
  if (0xf9 < (uint)(*(int *)(in_RDI + 0x98) + *(int *)(in_RDI + 0x94))) {
    lj_trace_err((jit_State *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),e);
  }
  return;
}

Assistant:

void lj_record_call(jit_State *J, BCReg func, ptrdiff_t nargs)
{
  rec_call_setup(J, func, nargs);
  /* Bump frame. */
  J->framedepth++;
  J->base += func+1+LJ_FR2;
  J->baseslot += func+1+LJ_FR2;
  if (J->baseslot + J->maxslot >= LJ_MAX_JSLOTS)
    lj_trace_err(J, LJ_TRERR_STACKOV);
}